

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint cacheId,bool isLoadMethod,bool isStore)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  undefined3 in_register_00000089;
  long lVar6;
  long lVar7;
  uint local_3a;
  undefined2 local_36;
  char cStack_34;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  _cStack_34 = CONCAT31(in_register_00000089,isStore);
  if (isLoadMethod && isStore) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x75b,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar2) goto LAB_0089a770;
    *puVar4 = 0;
  }
  if ((DAT_0159efbd == '\0') && (local_36 = (undefined2)value, value < 0x10000)) {
    local_3a = cacheId;
    uVar3 = Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,&local_3a,6);
    lVar6 = 3 - (ulong)(op < InvalidOpCode);
    if (lVar6 + (ulong)uVar3 + 6 != (ulong)(this->m_byteCodeData).currentOffset) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x761,
                                  "(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>))"
                                  ,
                                  "m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>)"
                                 );
      if (!bVar2) {
LAB_0089a770:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    lVar7 = 0x48;
    if (cStack_34 == '\0') {
      lVar7 = (ulong)isLoadMethod * 0x20 + 0x38;
    }
    puVar5 = (undefined8 *)
             new<Memory::ArenaAllocator>
                       (0x10,(this->m_labelOffsets->
                             super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>
                             ).alloc,0x364470);
    puVar5[1] = lVar6 + (ulong)uVar3;
    *puVar5 = *(undefined8 *)((long)&this->m_labelOffsets + lVar7);
    *(undefined8 **)((long)&this->m_labelOffsets + lVar7) = puVar5;
    *(int *)(&this->useBranchIsland + lVar7) = *(int *)(&this->useBranchIsland + lVar7) + 1;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ByteCodeWriter::TryWriteElementRootCP(OpCode op, RegSlot value, uint cacheId, bool isLoadMethod, bool isStore)
    {
        Assert(!isLoadMethod || !isStore);
        OpLayoutT_ElementRootCP<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::Assign(layout.inlineCacheIndex, cacheId))
        {
            size_t offset = m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);

            Assert(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_ElementRootCP<SizePolicy>));
            size_t inlineCacheOffset = offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum)
                + offsetof(OpLayoutT_ElementRootCP<SizePolicy>, inlineCacheIndex);

            // Root object inline cache index are given out from 0, but it will be at index after
            // all the plain inline cache. Store the offset of the inline cache index to patch it up later.
            SListBase<size_t> * rootObjectInlineCacheOffsets = isStore ?
                &rootObjectStoreInlineCacheOffsets : isLoadMethod ? &rootObjectLoadMethodInlineCacheOffsets : &rootObjectLoadInlineCacheOffsets;
            rootObjectInlineCacheOffsets->Prepend(this->m_labelOffsets->GetAllocator(), inlineCacheOffset);
            return true;
        }
        return false;
    }